

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTi.cpp
# Opt level: O0

void __thiscall OpenMD::NPTi::saveEta(NPTi *this)

{
  double dVar1;
  double *pdVar2;
  long in_RDI;
  Mat3x3d etaMat;
  Mat3x3d *in_stack_ffffffffffffff58;
  SquareMatrix3<double> *in_stack_ffffffffffffff60;
  Snapshot *this_00;
  RectMatrix<double,_3U,_3U> local_50;
  
  SquareMatrix3<double>::SquareMatrix3(in_stack_ffffffffffffff60,(double)in_stack_ffffffffffffff58);
  dVar1 = *(double *)(in_RDI + 0x208);
  pdVar2 = RectMatrix<double,_3U,_3U>::operator()(&local_50,0,0);
  *pdVar2 = dVar1;
  dVar1 = *(double *)(in_RDI + 0x208);
  pdVar2 = RectMatrix<double,_3U,_3U>::operator()(&local_50,1,1);
  *pdVar2 = dVar1;
  this_00 = *(Snapshot **)(in_RDI + 0x208);
  pdVar2 = RectMatrix<double,_3U,_3U>::operator()(&local_50,2,2);
  *pdVar2 = (double)this_00;
  Snapshot::setBarostat(this_00,in_stack_ffffffffffffff58);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x210cbb);
  return;
}

Assistant:

void NPTi::saveEta() {
    Mat3x3d etaMat(0.0);
    etaMat(0, 0) = eta;
    etaMat(1, 1) = eta;
    etaMat(2, 2) = eta;
    snap->setBarostat(etaMat);
  }